

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInputSource.cc
# Opt level: O3

qpdf_offset_t __thiscall FileInputSource::findAndSkipNextEOL(FileInputSource *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  void *pvVar4;
  void *pvVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char ch;
  char buf [10240];
  char local_2849;
  qpdf_offset_t local_2848;
  qpdf_offset_t local_2840;
  undefined1 local_2838 [10248];
  size_t __n;
  
  local_2840 = 0;
  bVar1 = false;
  do {
    local_2848 = QUtil::tell(this->file);
    iVar3 = (*(this->super_InputSource)._vptr_InputSource[7])(this,local_2838,0x2800);
    __n = CONCAT44(extraout_var,iVar3);
    if (__n == 0) {
      iVar3 = (*(this->super_InputSource)._vptr_InputSource[4])(this);
      return CONCAT44(extraout_var_01,iVar3);
    }
    pvVar4 = memchr(local_2838,0xd,__n);
    pvVar5 = memchr(local_2838,10,__n);
    if (pvVar5 == (void *)0x0 || pvVar4 == (void *)0x0) {
      if (pvVar4 != (void *)0x0) {
        pvVar5 = pvVar4;
      }
      if (pvVar5 != (void *)0x0) goto LAB_0011fba9;
    }
    else {
      if (pvVar4 <= pvVar5) {
        pvVar5 = pvVar4;
      }
LAB_0011fba9:
      (*(this->super_InputSource)._vptr_InputSource[5])
                (this,(long)pvVar5 + (local_2848 - (long)local_2838) + 1,0);
      do {
        bVar2 = bVar1;
        if (bVar1) goto LAB_0011fc0a;
        iVar3 = (*(this->super_InputSource)._vptr_InputSource[7])(this,&local_2849,1);
        bVar2 = true;
        if (CONCAT44(extraout_var_00,iVar3) == 0) goto LAB_0011fc0a;
      } while ((local_2849 == '\n') || (local_2849 == '\r'));
      (*(this->super_InputSource)._vptr_InputSource[8])(this,(ulong)(uint)(int)local_2849);
LAB_0011fc0a:
      bVar1 = bVar2;
      local_2840 = (long)pvVar5 + (local_2848 - (long)local_2838);
    }
    if (bVar1) {
      return local_2840;
    }
  } while( true );
}

Assistant:

qpdf_offset_t
FileInputSource::findAndSkipNextEOL()
{
    qpdf_offset_t result = 0;
    bool done = false;
    char buf[10240];
    while (!done) {
        qpdf_offset_t cur_offset = QUtil::tell(this->file);
        size_t len = this->read(buf, sizeof(buf));
        if (len == 0) {
            done = true;
            result = this->tell();
        } else {
            char* p1 = static_cast<char*>(memchr(buf, '\r', len));
            char* p2 = static_cast<char*>(memchr(buf, '\n', len));
            char* p = (p1 && p2) ? std::min(p1, p2) : p1 ? p1 : p2;
            if (p) {
                result = cur_offset + (p - buf);
                // We found \r or \n.  Keep reading until we get past \r and \n characters.
                this->seek(result + 1, SEEK_SET);
                char ch;
                while (!done) {
                    if (this->read(&ch, 1) == 0) {
                        done = true;
                    } else if (!((ch == '\r') || (ch == '\n'))) {
                        this->unreadCh(ch);
                        done = true;
                    }
                }
            }
        }
    }
    return result;
}